

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void crec_finalizer(jit_State *J,TRef trcd,TRef trfin,cTValue *fin)

{
  TRef TVar1;
  long in_RCX;
  TRef in_EDX;
  uint in_ESI;
  jit_State *in_RDI;
  jit_State *unaff_retaddr;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int32_t k;
  IROp op;
  jit_State *pjVar2;
  
  op = (IROp)((ulong)in_RDI >> 0x20);
  if (*(int *)(in_RCX + 4) + 4U < 0xfffffff7) {
    if (*(int *)(in_RCX + 4) != -1) {
      lj_trace_err((jit_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   (TraceError)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    }
    in_EDX = lj_ir_kptr_(unaff_retaddr,op,(void *)CONCAT44(in_ESI,in_EDX));
    k = (int32_t)((ulong)in_RCX >> 0x20);
  }
  else {
    if (in_EDX == 0) {
      in_EDX = lj_ir_kptr_(unaff_retaddr,op,(void *)((ulong)in_ESI << 0x20));
    }
    k = (int32_t)((ulong)in_RCX >> 0x20);
  }
  pjVar2 = in_RDI;
  TVar1 = lj_ir_kint((jit_State *)CONCAT44(in_ESI,in_EDX),k);
  lj_ir_call(in_RDI,IRCALL_lj_cdata_setfin,(ulong)in_ESI,(ulong)in_EDX,(ulong)TVar1);
  pjVar2->needsnap = '\x01';
  return;
}

Assistant:

static void crec_finalizer(jit_State *J, TRef trcd, TRef trfin, cTValue *fin)
{
  if (tvisgcv(fin)) {
    if (!trfin) trfin = lj_ir_kptr(J, gcval(fin));
  } else if (tvisnil(fin)) {
    trfin = lj_ir_kptr(J, NULL);
  } else {
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  }
  lj_ir_call(J, IRCALL_lj_cdata_setfin, trcd,
	     trfin, lj_ir_kint(J, (int32_t)itype(fin)));
  J->needsnap = 1;
}